

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

uint32_t SearchColorGreedy(uint32_t *palette,int palette_size,uint32_t color)

{
  uint32_t color_local;
  int palette_size_local;
  uint32_t *palette_local;
  uint32_t local_4;
  
  if (color == *palette) {
    local_4 = 0;
  }
  else if (color == palette[1]) {
    local_4 = 1;
  }
  else if (color == palette[2]) {
    local_4 = 2;
  }
  else {
    local_4 = 3;
  }
  return local_4;
}

Assistant:

static WEBP_INLINE uint32_t SearchColorGreedy(const uint32_t palette[],
                                              int palette_size,
                                              uint32_t color) {
  (void)palette_size;
  assert(palette_size < APPLY_PALETTE_GREEDY_MAX);
  assert(3 == APPLY_PALETTE_GREEDY_MAX - 1);
  if (color == palette[0]) return 0;
  if (color == palette[1]) return 1;
  if (color == palette[2]) return 2;
  return 3;
}